

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

void __thiscall btDiscreteDynamicsWorld::~btDiscreteDynamicsWorld(btDiscreteDynamicsWorld *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__btDiscreteDynamicsWorld_002e76e8;
  if ((*(byte *)(in_RDI + 0x2f) & 1) != 0) {
    (*(code *)**(undefined8 **)in_RDI[0x23])();
    btAlignedFreeInternal((void *)0x22708f);
  }
  if (in_RDI[0x21] != 0) {
    (*(code *)**(undefined8 **)in_RDI[0x21])();
    btAlignedFreeInternal((void *)0x2270c7);
  }
  if ((*(byte *)((long)in_RDI + 0x179) & 1) != 0) {
    (*(code *)**(undefined8 **)in_RDI[0x22])();
    btAlignedFreeInternal((void *)0x2270fe);
  }
  btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btPersistentManifold_*> *)0x227113);
  btAlignedObjectArray<btActionInterface_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btActionInterface_*> *)0x227124);
  btAlignedObjectArray<btRigidBody_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btRigidBody_*> *)0x227135);
  btAlignedObjectArray<btTypedConstraint_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btTypedConstraint_*> *)0x227146);
  btAlignedObjectArray<btTypedConstraint_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btTypedConstraint_*> *)0x227157);
  btDynamicsWorld::~btDynamicsWorld((btDynamicsWorld *)0x227161);
  return;
}

Assistant:

btDiscreteDynamicsWorld::~btDiscreteDynamicsWorld()
{
	//only delete it when we created it
	if (m_ownsIslandManager)
	{
		m_islandManager->~btSimulationIslandManager();
		btAlignedFree( m_islandManager);
	}
	if (m_solverIslandCallback)
	{
		m_solverIslandCallback->~InplaceSolverIslandCallback();
		btAlignedFree(m_solverIslandCallback);
	}
	if (m_ownsConstraintSolver)
	{

		m_constraintSolver->~btConstraintSolver();
		btAlignedFree(m_constraintSolver);
	}
}